

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O3

void ImGui_ImplSDL2_UpdateGamepadButton
               (ImGui_ImplSDL2_Data *bd,ImGuiIO *io,ImGuiKey key,SDL_GameControllerButton button_no)

{
  char cVar1;
  undefined4 in_register_00000014;
  long lVar2;
  undefined4 in_R8D;
  bool down;
  
  if ((int)bd == 0) {
    down = false;
  }
  else {
    lVar2 = 0;
    down = false;
    do {
      cVar1 = SDL_GameControllerGetButton(*(undefined8 *)((long)&io->ConfigFlags + lVar2),in_R8D);
      down = (bool)(down | cVar1 != '\0');
      lVar2 = lVar2 + 8;
    } while ((long)(int)bd * 8 != lVar2);
  }
  ImGuiIO::AddKeyEvent((ImGuiIO *)CONCAT44(in_register_00000014,key),button_no,down);
  return;
}

Assistant:

static void ImGui_ImplSDL2_UpdateGamepadButton(ImGui_ImplSDL2_Data* bd, ImGuiIO& io, ImGuiKey key, SDL_GameControllerButton button_no)
{
    bool merged_value = false;
    for (SDL_GameController* gamepad : bd->Gamepads)
        merged_value |= SDL_GameControllerGetButton(gamepad, button_no) != 0;
    io.AddKeyEvent(key, merged_value);
}